

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O3

int Pdr_ManCountVariables(Pdr_Man_t *p,int kStart)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  int *__ptr;
  Vec_Ptr_t *vCubes;
  void **__dest;
  Vec_Int_t *__ptr_00;
  long lVar3;
  int iVar4;
  
  pVVar2 = p->vInfCubes;
  if (pVVar2 == (Vec_Ptr_t *)0x0) {
    vCubes = Pdr_ManCollectCubes(p,kStart);
  }
  else {
    vCubes = (Vec_Ptr_t *)malloc(0x10);
    iVar4 = pVVar2->nSize;
    vCubes->nSize = iVar4;
    iVar1 = pVVar2->nCap;
    vCubes->nCap = iVar1;
    if ((long)iVar1 == 0) {
      __dest = (void **)0x0;
    }
    else {
      __dest = (void **)malloc((long)iVar1 << 3);
    }
    vCubes->pArray = __dest;
    memcpy(__dest,pVVar2->pArray,(long)iVar4 << 3);
  }
  __ptr_00 = Pdr_ManCountFlops(p,vCubes);
  __ptr = __ptr_00->pArray;
  if ((long)__ptr_00->nSize < 1) {
    iVar4 = 0;
    if (__ptr == (int *)0x0) goto LAB_005f064a;
  }
  else {
    lVar3 = 0;
    iVar4 = 0;
    do {
      iVar4 = iVar4 + (uint)(0 < __ptr[lVar3]);
      lVar3 = lVar3 + 1;
    } while (__ptr_00->nSize != lVar3);
  }
  free(__ptr);
LAB_005f064a:
  free(__ptr_00);
  if (vCubes->pArray != (void **)0x0) {
    free(vCubes->pArray);
  }
  free(vCubes);
  return iVar4;
}

Assistant:

int Pdr_ManCountVariables( Pdr_Man_t * p, int kStart )
{
    Vec_Int_t * vFlopCounts;
    Vec_Ptr_t * vCubes;
    int i, Entry, Counter = 0;
    if ( p->vInfCubes == NULL )
        vCubes = Pdr_ManCollectCubes( p, kStart );
    else
        vCubes = Vec_PtrDup( p->vInfCubes );
    vFlopCounts = Pdr_ManCountFlops( p, vCubes );
    Vec_IntForEachEntry( vFlopCounts, Entry, i )
        Counter += (Entry > 0);
    Vec_IntFreeP( &vFlopCounts );
    Vec_PtrFree( vCubes );
    return Counter;
}